

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t __n;
  
  if (X != Y) {
    if (Y->n == 0) {
      if (X->n != 0) {
        X->s = 1;
        switchD_016d4fed::default(X->p,0,(ulong)X->n << 3);
      }
    }
    else {
      uVar2 = (ulong)(Y->n - 1);
      __n = uVar2 * 8 + 8;
      while ((uVar2 != 0 && (Y->p[uVar2] == 0))) {
        __n = __n - 8;
        uVar2 = uVar2 - 1;
      }
      X->s = Y->s;
      lVar3 = X->n - uVar2;
      if (X->n < uVar2 || lVar3 == 0) {
        iVar1 = mbedtls_mpi_grow(X,uVar2 + 1);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        switchD_016d4fed::default(X->p + uVar2 + 1,0,lVar3 * 8 - 8);
      }
      switchD_016b0717::default(X->p,Y->p,__n);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_copy(mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    int ret = 0;
    size_t i;

    if (X == Y) {
        return 0;
    }

    if (Y->n == 0) {
        if (X->n != 0) {
            X->s = 1;
            memset(X->p, 0, X->n * ciL);
        }
        return 0;
    }

    for (i = Y->n - 1; i > 0; i--) {
        if (Y->p[i] != 0) {
            break;
        }
    }
    i++;

    X->s = Y->s;

    if (X->n < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i));
    } else {
        memset(X->p + i, 0, (X->n - i) * ciL);
    }

    memcpy(X->p, Y->p, i * ciL);

cleanup:

    return ret;
}